

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::build_function_control_flow_graphs_and_analyze(Compiler *this)

{
  TypedID<(spirv_cross::Types)6> *pTVar1;
  int iVar2;
  CFG *__ptr;
  size_t sVar3;
  TypedID<(spirv_cross::Types)2> *pTVar4;
  uint *puVar5;
  Variant *pVVar6;
  bool bVar7;
  bool bVar8;
  default_delete<spirv_cross::CFG> *this_00;
  CFG *this_01;
  SPIRFunction *pSVar9;
  SPIRBlock *pSVar10;
  Bitset *pBVar11;
  SPIRVariable *pSVar12;
  Bitset *pBVar13;
  size_type sVar14;
  SPIRType *pSVar15;
  ulong uVar16;
  SPIRConstant *pSVar17;
  _Hash_node_base *p_Var18;
  TypedID<(spirv_cross::Types)6> *pTVar19;
  __node_base *p_Var20;
  TypedID<(spirv_cross::Types)2> *pTVar21;
  long lVar22;
  bool bVar23;
  AnalyzeVariableScopeAccessHandler scope_handler;
  CFGBuilder handler;
  AnalyzeVariableScopeAccessHandler local_220;
  OpcodeHandler local_78;
  Compiler *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_78._vptr_OpcodeHandler = (_func_int **)&PTR__CFGBuilder_003613f8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_220.super_OpcodeHandler._vptr_OpcodeHandler._0_4_ = (this->ir).default_entry_point.id;
  local_70 = this;
  this_00 = (default_delete<spirv_cross::CFG> *)
            ::std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&local_68,(key_type *)&local_220);
  this_01 = (CFG *)operator_new(0x168);
  pSVar9 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (this->ir).default_entry_point.id);
  CFG::CFG(this_01,this,pSVar9);
  __ptr = *(CFG **)this_00;
  *(CFG **)this_00 = this_01;
  if (__ptr != (CFG *)0x0) {
    ::std::default_delete<spirv_cross::CFG>::operator()(this_00,__ptr);
  }
  pSVar9 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar9,&local_78);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->function_cfgs)._M_h,&local_68);
  p_Var18 = (this->function_cfgs)._M_h._M_before_begin._M_nxt;
  uVar16 = (this->function_cfgs)._M_h._M_element_count;
  if (p_Var18 != (_Hash_node_base *)0x0) {
    do {
      pSVar9 = Variant::get<spirv_cross::SPIRFunction>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&p_Var18[1]._M_nxt);
      local_220.super_OpcodeHandler._vptr_OpcodeHandler =
           (_func_int **)&PTR__AnalyzeVariableScopeAccessHandler_00361348;
      local_220.accessed_variables_to_block._M_h._M_buckets =
           &local_220.accessed_variables_to_block._M_h._M_single_bucket;
      local_220.accessed_variables_to_block._M_h._M_bucket_count = 1;
      local_220.accessed_variables_to_block._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_220.accessed_variables_to_block._M_h._M_element_count = 0;
      local_220.accessed_variables_to_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_220.accessed_variables_to_block._M_h._M_rehash_policy._M_next_resize = 0;
      local_220.accessed_variables_to_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_220.accessed_temporaries_to_block._M_h._M_buckets =
           &local_220.accessed_temporaries_to_block._M_h._M_single_bucket;
      local_220.accessed_temporaries_to_block._M_h._M_bucket_count = 1;
      local_220.accessed_temporaries_to_block._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_220.accessed_temporaries_to_block._M_h._M_element_count = 0;
      local_220.accessed_temporaries_to_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_220.accessed_temporaries_to_block._M_h._M_rehash_policy._M_next_resize = 0;
      local_220.accessed_temporaries_to_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_220.result_id_to_type._M_h._M_buckets =
           &local_220.result_id_to_type._M_h._M_single_bucket;
      local_220.result_id_to_type._M_h._M_bucket_count = 1;
      local_220.result_id_to_type._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_220.result_id_to_type._M_h._M_element_count = 0;
      local_220.result_id_to_type._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_220.result_id_to_type._M_h._M_rehash_policy._M_next_resize = 0;
      local_220.result_id_to_type._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_220.complete_write_variables_to_block._M_h._M_buckets =
           &local_220.complete_write_variables_to_block._M_h._M_single_bucket;
      local_220.complete_write_variables_to_block._M_h._M_bucket_count = 1;
      local_220.complete_write_variables_to_block._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      local_220.complete_write_variables_to_block._M_h._M_element_count = 0;
      local_220.complete_write_variables_to_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_220.complete_write_variables_to_block._M_h._M_rehash_policy._M_next_resize = 0;
      local_220.complete_write_variables_to_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_220.partial_write_variables_to_block._M_h._M_buckets =
           &local_220.partial_write_variables_to_block._M_h._M_single_bucket;
      local_220.partial_write_variables_to_block._M_h._M_bucket_count = 1;
      local_220.partial_write_variables_to_block._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      local_220.partial_write_variables_to_block._M_h._M_element_count = 0;
      local_220.partial_write_variables_to_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_220.partial_write_variables_to_block._M_h._M_rehash_policy._M_next_resize = 0;
      local_220.partial_write_variables_to_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_220.access_chain_expressions._M_h._M_buckets =
           &local_220.access_chain_expressions._M_h._M_single_bucket;
      local_220.access_chain_expressions._M_h._M_bucket_count = 1;
      local_220.access_chain_expressions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_220.access_chain_expressions._M_h._M_element_count = 0;
      local_220.access_chain_expressions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_220.access_chain_expressions._M_h._M_rehash_policy._M_next_resize = 0;
      local_220.access_chain_expressions._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_220.rvalue_forward_children._M_h._M_buckets =
           &local_220.rvalue_forward_children._M_h._M_single_bucket;
      local_220.rvalue_forward_children._M_h._M_bucket_count = 1;
      local_220.rvalue_forward_children._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_220.rvalue_forward_children._M_h._M_element_count = 0;
      local_220.rvalue_forward_children._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_220.rvalue_forward_children._M_h._M_rehash_policy._M_next_resize = 0;
      local_220.rvalue_forward_children._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_220.current_block = (SPIRBlock *)0x0;
      local_220.compiler = this;
      local_220.entry = pSVar9;
      analyze_variable_scope(this,pSVar9,&local_220);
      find_function_local_luts(this,pSVar9,&local_220,uVar16 < 2);
      sVar3 = (pSVar9->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
              buffer_size;
      if (sVar3 != 0) {
        pTVar19 = (pSVar9->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
                  ptr;
        pTVar1 = pTVar19 + sVar3;
        do {
          pSVar10 = Variant::get<spirv_cross::SPIRBlock>
                              ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               pTVar19->id);
          if (1 < (pSVar10->loop_variables).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size) {
            pBVar11 = ParsedIR::get_decoration_bitset
                                (&this->ir,
                                 (ID)((pSVar10->loop_variables).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                     .ptr)->id);
            pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                 ((pSVar10->loop_variables).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
                                 )->id);
            sVar3 = (pSVar10->loop_variables).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
            if (sVar3 != 0) {
              iVar2 = *(int *)&(pSVar12->super_IVariant).field_0xc;
              pTVar21 = (pSVar10->loop_variables).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
              pTVar4 = pTVar21 + sVar3;
              bVar7 = false;
              do {
                pBVar13 = ParsedIR::get_decoration_bitset(&this->ir,(ID)pTVar21->id);
                bVar23 = true;
                bVar8 = true;
                if ((pBVar11->lower == pBVar13->lower) &&
                   (bVar8 = true,
                   (pBVar11->higher)._M_h._M_element_count ==
                   (pBVar13->higher)._M_h._M_element_count)) {
                  p_Var20 = &(pBVar11->higher)._M_h._M_before_begin;
                  do {
                    p_Var20 = p_Var20->_M_nxt;
                    if (p_Var20 == (__node_base *)0x0) {
                      pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                                          ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr
                                           + ((pSVar10->loop_variables).
                                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                             .ptr)->id);
                      bVar23 = iVar2 != *(int *)&(pSVar12->super_IVariant).field_0xc;
                      bVar8 = bVar7;
                      if (bVar23) {
                        bVar8 = true;
                      }
                      goto LAB_00297b94;
                    }
                    sVar14 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::count(&(pBVar13->higher)._M_h,(key_type *)(p_Var20 + 1));
                  } while (sVar14 != 0);
                  bVar23 = true;
                  bVar8 = true;
                }
LAB_00297b94:
                if (bVar23) break;
                pTVar21 = pTVar21 + 1;
                bVar7 = bVar8;
              } while (pTVar21 != pTVar4);
              if (bVar8) {
                sVar3 = (pSVar10->loop_variables).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
                if (sVar3 != 0) {
                  pTVar4 = (pSVar10->loop_variables).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
                  lVar22 = 0;
                  do {
                    pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                                        ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                         *(uint *)((long)&pTVar4->id + lVar22));
                    pSVar12->loop_variable = false;
                    lVar22 = lVar22 + 4;
                  } while (sVar3 << 2 != lVar22);
                }
                (pSVar10->loop_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size = 0;
              }
            }
          }
          pTVar19 = pTVar19 + 1;
        } while (pTVar19 != pTVar1);
      }
      local_220.super_OpcodeHandler._vptr_OpcodeHandler =
           (_func_int **)&PTR__AnalyzeVariableScopeAccessHandler_00361348;
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_220.rvalue_forward_children._M_h);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_220.access_chain_expressions._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_220.partial_write_variables_to_block._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_220.complete_write_variables_to_block._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_220.result_id_to_type._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_220.accessed_temporaries_to_block._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_220.accessed_variables_to_block._M_h);
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
  }
  if ((1 < uVar16) &&
     (sVar3 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size, sVar3 != 0)) {
    puVar5 = (this->global_variables).super_VectorView<unsigned_int>.ptr;
    lVar22 = 0;
    do {
      pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)((long)puVar5 + lVar22));
      pSVar15 = get_variable_data_type(this,pSVar12);
      if (((((*(uint *)&(pSVar15->super_IVariant).field_0xc & 0xfffffffe) == 0x1c) &&
           (pSVar12->storage == StorageClassPrivate)) &&
          (uVar16 = (ulong)(pSVar12->initializer).id, uVar16 != 0)) &&
         ((pSVar12->is_written_to == false &&
          (pVVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar6[uVar16].type == TypeConstant)))) {
        pSVar17 = Variant::get<spirv_cross::SPIRConstant>(pVVar6 + uVar16);
        pSVar17->is_used_as_lut = true;
        (pSVar12->static_expression).id = (pSVar12->initializer).id;
        pSVar12->statically_assigned = true;
        pSVar12->remapped_variable = true;
      }
      lVar22 = lVar22 + 4;
    } while (sVar3 << 2 != lVar22);
  }
  local_78._vptr_OpcodeHandler = (_func_int **)&PTR__CFGBuilder_003613f8;
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void Compiler::build_function_control_flow_graphs_and_analyze()
{
	CFGBuilder handler(*this);
	handler.function_cfgs[ir.default_entry_point].reset(new CFG(*this, get<SPIRFunction>(ir.default_entry_point)));
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	function_cfgs = std::move(handler.function_cfgs);
	bool single_function = function_cfgs.size() <= 1;

	for (auto &f : function_cfgs)
	{
		auto &func = get<SPIRFunction>(f.first);
		AnalyzeVariableScopeAccessHandler scope_handler(*this, func);
		analyze_variable_scope(func, scope_handler);
		find_function_local_luts(func, scope_handler, single_function);

		// Check if we can actually use the loop variables we found in analyze_variable_scope.
		// To use multiple initializers, we need the same type and qualifiers.
		for (auto block : func.blocks)
		{
			auto &b = get<SPIRBlock>(block);
			if (b.loop_variables.size() < 2)
				continue;

			auto &flags = get_decoration_bitset(b.loop_variables.front());
			uint32_t type = get<SPIRVariable>(b.loop_variables.front()).basetype;
			bool invalid_initializers = false;
			for (auto loop_variable : b.loop_variables)
			{
				if (flags != get_decoration_bitset(loop_variable) ||
				    type != get<SPIRVariable>(b.loop_variables.front()).basetype)
				{
					invalid_initializers = true;
					break;
				}
			}

			if (invalid_initializers)
			{
				for (auto loop_variable : b.loop_variables)
					get<SPIRVariable>(loop_variable).loop_variable = false;
				b.loop_variables.clear();
			}
		}
	}

	// Find LUTs which are not function local. Only consider this case if the CFG is multi-function,
	// otherwise we treat Private as Function trivially.
	// Needs to be analyzed from the outside since we have to block the LUT optimization if at least
	// one function writes to it.
	if (!single_function)
	{
		for (auto &id : global_variables)
		{
			auto &var = get<SPIRVariable>(id);
			auto &type = get_variable_data_type(var);

			if (is_array(type) && var.storage == StorageClassPrivate &&
			    var.initializer && !var.is_written_to &&
			    ir.ids[var.initializer].get_type() == TypeConstant)
			{
				get<SPIRConstant>(var.initializer).is_used_as_lut = true;
				var.static_expression = var.initializer;
				var.statically_assigned = true;
				var.remapped_variable = true;
			}
		}
	}
}